

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void write_oam_no_mode_check(Emulator *e,MaskedAddress addr,u8 value)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  
  uVar1 = CONCAT62(in_register_00000032,addr) >> 2 & 0x3fffffff;
  switch((uint)CONCAT62(in_register_00000032,addr) & 3) {
  case 0:
    (e->state).oam[uVar1].y = value + 0xf0;
    return;
  case 1:
    (e->state).oam[uVar1].x = value + 0xf8;
    return;
  case 2:
    (e->state).oam[uVar1].tile = value;
    return;
  case 3:
    (e->state).oam[uVar1].byte3 = value;
    (e->state).oam[uVar1].priority = (uint)(value >> 7);
    (e->state).oam[uVar1].yflip = value >> 6 & TRUE;
    (e->state).oam[uVar1].xflip = value >> 5 & TRUE;
    (e->state).oam[uVar1].palette = value >> 4 & 1;
    (e->state).oam[uVar1].bank = value >> 3 & 1;
    (e->state).oam[uVar1].cgb_palette = value & 7;
    return;
  }
}

Assistant:

static void write_oam_no_mode_check(Emulator* e, MaskedAddress addr, u8 value) {
  Obj* obj = &OAM[addr >> 2];
  switch (addr & 3) {
    case 0: obj->y = value - OBJ_Y_OFFSET; break;
    case 1: obj->x = value - OBJ_X_OFFSET; break;
    case 2: obj->tile = value; break;
    case 3:
      obj->byte3 = value;
      obj->priority = UNPACK(value, OBJ_PRIORITY);
      obj->yflip = UNPACK(value, OBJ_YFLIP);
      obj->xflip = UNPACK(value, OBJ_XFLIP);
      obj->palette = UNPACK(value, OBJ_PALETTE);
      obj->bank = UNPACK(value, OBJ_BANK);
      obj->cgb_palette = UNPACK(value, OBJ_CGB_PALETTE);
      break;
  }
}